

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSRefCountHeader *p;
  int64_t idx;
  JSValue obj;
  JSValue JVar2;
  JSValue val;
  int64_t len;
  long local_48;
  int64_t local_40;
  int64_t local_38;
  
  obj = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,&local_38,obj);
  if ((iVar1 == 0) &&
     ((local_40 = 0, argc < 2 ||
      ((((int)argv[1].tag == 3 ||
        (JVar2.tag = argv[1].tag, JVar2.u.ptr = argv[1].u.ptr,
        iVar1 = JS_ToInt64Clamp(ctx,&local_40,JVar2,0,local_38,local_38), iVar1 == 0)) &&
       ((local_48 = local_38, argc == 2 ||
        (((int)argv[2].tag == 3 ||
         (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
         iVar1 = JS_ToInt64Clamp(ctx,&local_48,val,0,local_38,local_38), local_38 = local_48,
         iVar1 == 0)))))))))) {
    idx = local_40;
    if (local_40 < local_38) {
      do {
        JVar2 = *argv;
        if (0xfffffff4 < (uint)argv->tag) {
          *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
        }
        iVar1 = JS_SetPropertyInt64(ctx,obj,idx,JVar2);
        if (iVar1 < 0) goto LAB_0016218f;
        idx = idx + 1;
      } while (local_38 != idx);
    }
  }
  else {
LAB_0016218f:
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar1 = *obj.u.ptr, *(int *)obj.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,obj);
    }
    obj = (JSValue)(ZEXT816(6) << 0x40);
  }
  return obj;
}

Assistant:

static JSValue js_array_fill(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, start, end;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    start = 0;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        if (JS_ToInt64Clamp(ctx, &start, argv[1], 0, len, len))
            goto exception;
    }

    end = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &end, argv[2], 0, len, len))
            goto exception;
    }

    /* XXX: should special case fast arrays */
    while (start < end) {
        if (JS_SetPropertyInt64(ctx, obj, start,
                                JS_DupValue(ctx, argv[0])) < 0)
            goto exception;
        start++;
    }
    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}